

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

string * iutest::PrintToString<char[2]>(string *__return_storage_ptr__,char (*v) [2])

{
  size_t sVar1;
  iu_global_format_stringstream strm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  sVar1 = strlen(*v);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,v,*v + sVar1);
  detail::
  iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print(&local_1c0,(iu_ostream *)(local_1a0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToString(const T& v)
{
    iu_global_format_stringstream strm;
    detail::UniversalTersePrint(v, &strm);
    return strm.str();
}